

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

err_t fileRead(size_t *read,void *buf,size_t count,file_t file)

{
  int iVar1;
  size_t sVar2;
  FILE *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  size_t *in_RDI;
  undefined4 local_4;
  
  sVar2 = fread(in_RSI,1,in_RDX,in_RCX);
  *in_RDI = sVar2;
  if (*in_RDI == in_RDX) {
    local_4 = 0;
  }
  else {
    iVar1 = feof(in_RCX);
    local_4 = 0xcf;
    if (iVar1 != 0) {
      local_4 = 0xffffffff;
    }
  }
  return local_4;
}

Assistant:

err_t fileRead(size_t* read, void* buf, size_t count, file_t file)
{
	ASSERT(memIsValid(buf, count));
	ASSERT(fileIsValid(file));
	ASSERT(memIsValid(read, O_PER_S));
	*read = fread(buf, 1, count, file);
	if (*read != count)
		return feof(file) ? ERR_MAX : ERR_FILE_READ;
	return ERR_OK;
}